

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_add_serverhello_tlsext(SSL_HANDSHAKE *hs,CBB *out)

{
  uint16_t uVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  uint local_5c;
  undefined1 local_58 [4];
  uint i;
  CBB extensions;
  SSL *ssl;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  extensions.u._24_8_ = hs->ssl;
  iVar2 = CBB_add_u16_length_prefixed(out,(CBB *)local_58);
  if (iVar2 == 0) {
LAB_0016674f:
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xfb2);
    hs_local._7_1_ = false;
  }
  else {
    for (local_5c = 0; local_5c < 0x1c; local_5c = local_5c + 1) {
      if ((((hs->extensions).sent & 1 << ((byte)local_5c & 0x1f)) != 0) &&
         (uVar3 = (**(code **)(kExtensions + (ulong)local_5c * 0x28 + 0x20))(hs), (uVar3 & 1) == 0))
      {
        ERR_put_error(0x10,0,0x93,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xfa3);
        ERR_add_error_dataf("extension %u");
        goto LAB_0016674f;
      }
    }
    uVar1 = ssl_protocol_version((SSL *)extensions.u._24_8_);
    if ((uVar1 < 0x304) && (sVar4 = CBB_len((CBB *)local_58), sVar4 == 0)) {
      CBB_discard_child(out);
    }
    iVar2 = CBB_flush(out);
    hs_local._7_1_ = iVar2 != 0;
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_add_serverhello_tlsext(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  CBB extensions;
  if (!CBB_add_u16_length_prefixed(out, &extensions)) {
    goto err;
  }

  for (unsigned i = 0; i < kNumExtensions; i++) {
    if (!(hs->extensions.received & (1u << i))) {
      // Don't send extensions that were not received.
      continue;
    }

    if (!kExtensions[i].add_serverhello(hs, &extensions)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_ERROR_ADDING_EXTENSION);
      ERR_add_error_dataf("extension %u", (unsigned)kExtensions[i].value);
      goto err;
    }
  }

  // Discard empty extensions blocks before TLS 1.3.
  if (ssl_protocol_version(ssl) < TLS1_3_VERSION &&  //
      CBB_len(&extensions) == 0) {
    CBB_discard_child(out);
  }

  return CBB_flush(out);

err:
  OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
  return false;
}